

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_timer.c
# Opt level: O0

uint64_t amqp_get_monotonic_timestamp(void)

{
  int iVar1;
  timespec tp;
  timespec local_18;
  uint64_t local_8;
  
  iVar1 = clock_gettime(1,&local_18);
  if (iVar1 == -1) {
    local_8 = 0;
  }
  else {
    local_8 = local_18.tv_sec * 1000000000 + local_18.tv_nsec;
  }
  return local_8;
}

Assistant:

uint64_t
amqp_get_monotonic_timestamp(void)
{
#ifdef __hpux
  return (uint64_t)gethrtime();
#else
  struct timespec tp;
  if (-1 == clock_gettime(CLOCK_MONOTONIC, &tp)) {
    return 0;
  }

  return ((uint64_t)tp.tv_sec * AMQP_NS_PER_S + (uint64_t)tp.tv_nsec);
#endif
}